

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

ZNode * new_ZNode(Parser *p,PNode *pn)

{
  ZNode *pZVar1;
  
  pZVar1 = p->free_znodes;
  if (pZVar1 == (ZNode *)0x0) {
    pZVar1 = (ZNode *)malloc(0x30);
  }
  else {
    p->free_znodes = (ZNode *)pZVar1->pn;
  }
  pZVar1->pn = pn;
  pn->refcount = pn->refcount + 1;
  (pZVar1->sns).n = 0;
  (pZVar1->sns).v = (SNode **)0x0;
  return pZVar1;
}

Assistant:

static ZNode *new_ZNode(Parser *p, PNode *pn) {
  ZNode *z = p->free_znodes;
  if (!z)
    z = MALLOC(sizeof *z);
  else
    p->free_znodes = znode_next(z);
  z->pn = pn;
  ref_pn(pn);
  vec_clear(&z->sns);
  return z;
}